

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O1

void __thiscall OrderGrid::fontChanged(OrderGrid *this)

{
  CellPainter *this_00;
  int iVar1;
  
  this_00 = &this->mCellPainter;
  CellPainter::setFont(this_00,(QFont *)(*(long *)&this->field_0x20 + 0x38));
  iVar1 = CellPainter::cellWidth(this_00);
  (this->mGridRect).x1 = iVar1 * 2 + 9;
  (this->mGridRect).x2 = iVar1 * 0xf + 8;
  QWidget::setMinimumWidth((int)this);
  iVar1 = CellPainter::calculateRowsAvailable
                    (this_00,(*(int *)(*(long *)&this->field_0x20 + 0x20) -
                             *(int *)(*(long *)&this->field_0x20 + 0x18)) + 1);
  this->mVisibleRows = iVar1;
  return;
}

Assistant:

void OrderGrid::fontChanged() {
    mCellPainter.setFont(font());

    auto const cellWidth = mCellPainter.cellWidth();

    mGridRect.setX(2 * (SPACING + cellWidth) + LINE_WIDTH);
    mGridRect.setWidth(13 * cellWidth);

    // determine minimum width
    setMinimumWidth(mGridRect.right());

    mVisibleRows = mCellPainter.calculateRowsAvailable(height());
}